

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbif.cpp
# Opt level: O1

void __thiscall CVmBifTable::add_entry(CVmBifTable *this,char *func_set_id)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  vm_bif_entry_t *this_00;
  size_t entry_name_len;
  size_t name_len;
  
  ensure_space(this,(ulong)this->count_ + 1,5);
  pcVar2 = lib_find_vsn_suffix(func_set_id,'/',"000000",&name_len);
  this_00 = G_bif_reg_table;
  if (G_bif_reg_table[0].func_set_id != (char *)0x0) {
    pcVar3 = G_bif_reg_table[0].func_set_id;
    do {
      pcVar3 = lib_find_vsn_suffix(pcVar3,'/',"000000",&entry_name_len);
      if ((name_len == entry_name_len) &&
         (iVar1 = bcmp(func_set_id,this_00->func_set_id,name_len), iVar1 == 0)) {
        iVar1 = strcmp(pcVar2,pcVar3);
        if (iVar1 < 1) {
          this->table_[this->count_] = this_00;
          pcVar2 = lib_copy_str(func_set_id);
          this->names_[this->count_] = pcVar2;
          vm_bif_entry_t::link_to_image(this_00,this->count_);
          this->count_ = this->count_ + 1;
          return;
        }
        err_throw_a(0x14a,4,2,func_set_id,2,pcVar3,7,func_set_id,8);
      }
      pcVar3 = this_00[1].func_set_id;
      this_00 = this_00 + 1;
    } while (pcVar3 != (char *)0x0);
  }
  add_entry_unresolved(this,func_set_id);
  return;
}

Assistant:

void CVmBifTable::add_entry(VMG_ const char *func_set_id)
{
    vm_bif_entry_t *entry;
    const char *vsn;
    size_t name_len;

    /* ensure we have space for one more entry */
    ensure_space(count_ + 1, 5);

    /* find the version suffix in the name, if any */
    vsn = lib_find_vsn_suffix(func_set_id, '/', "000000", &name_len);

    /* look up the function set by name */
    for (entry = G_bif_reg_table ; entry->func_set_id != 0 ; ++entry)
    {
        const char *entry_vsn;
        size_t entry_name_len;

        /* find the version number in this entry */
        entry_vsn = lib_find_vsn_suffix(entry->func_set_id, '/', "000000",
                                        &entry_name_len);

        /* see if this is a match */
        if (name_len == entry_name_len
            && memcmp(func_set_id, entry->func_set_id, name_len) == 0)
        {
            /* 
             *   make sure the version provided in the VM is at least as
             *   high as the requested version 
             */
            if (strcmp(vsn, entry_vsn) > 0)
            {
                /* it's out of date - throw "function set too old" */
                err_throw_a(VMERR_FUNCSET_TOO_OLD, 4,
                            ERR_TYPE_TEXTCHAR, func_set_id,
                            ERR_TYPE_TEXTCHAR, entry_vsn,
                            ERR_TYPE_FUNCSET, func_set_id,
                            ERR_TYPE_VERSION_FLAG);
            }

            /* 
             *   It's a match - add the new entry.  Simply keep a pointer
             *   to the static table entry. 
             */
            table_[count_] = entry;

            /* store the new name element as well */
            names_[count_] = lib_copy_str(func_set_id);

            /* complete the linkage to the image file */
            entry->link_to_image(vmg_ count_);

            /* count the new entry */
            ++count_;

            /* we're done */
            return;
        }
    }

    /* we didn't find it - handle it according to our resolution mode */
    add_entry_unresolved(vmg_ func_set_id);
}